

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::CheckTargetsForPchCompilePdb(cmGlobalGenerator *this)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  GeneratorTargetVector *this_02;
  pointer pcVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  string *b;
  cmake *this_03;
  bool local_19b;
  byte local_18a;
  undefined1 local_178 [16];
  undefined1 local_168 [8];
  string e;
  string local_140;
  _Base_ptr local_120;
  string *compilePdb;
  string local_110;
  _Base_ptr local_f0;
  string *reuseFrom;
  string local_e0;
  cmValue local_c0;
  _Base_ptr local_b8;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *target;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *generator;
  const_iterator __end1;
  const_iterator __begin1;
  LocalGeneratorVector *__range1;
  undefined1 local_70 [4];
  bool failed;
  allocator<char> local_39;
  string local_38;
  cmGlobalGenerator *local_18;
  cmGlobalGenerator *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  __range1._6_1_ = 0;
  __range1._5_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"C",&local_39);
  bVar1 = GetLanguageEnabled(this,&local_38);
  local_18a = 0;
  if (!bVar1) {
    std::allocator<char>::allocator();
    __range1._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,"CXX",(allocator<char> *)((long)&__range1 + 7));
    __range1._5_1_ = 1;
    bVar1 = GetLanguageEnabled(this,(string *)local_70);
    local_18a = bVar1 ^ 0xff;
  }
  if ((__range1._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)local_70);
  }
  if ((__range1._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if ((local_18a & 1) == 0) {
    __range1._4_1_ = 0;
    __end1 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::begin(&this->LocalGenerators);
    generator = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                std::
                vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ::end(&this->LocalGenerators);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                       *)&generator), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                ::operator*(&__end1);
      this_01 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                operator->(this_00);
      this_02 = cmLocalGenerator::GetGeneratorTargets(this_01);
      __end2 = std::
               vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ::begin(this_02);
      target = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
               std::
               vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ::end(this_02);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                         *)&target), bVar1) {
        local_b8 = (_Base_ptr)
                   __gnu_cxx::
                   __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                   ::operator*(&__end2);
        pcVar2 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             *)local_b8);
        bVar1 = cmGeneratorTarget::CanCompileSources(pcVar2);
        reuseFrom._6_1_ = 0;
        reuseFrom._5_1_ = 0;
        local_19b = true;
        if (bVar1) {
          pcVar2 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               *)local_b8);
          std::allocator<char>::allocator();
          reuseFrom._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,"ghs_integrity_app",
                     (allocator<char> *)((long)&reuseFrom + 7));
          reuseFrom._5_1_ = 1;
          local_c0 = cmGeneratorTarget::GetProperty(pcVar2,&local_e0);
          local_19b = cmValue::IsOn(&local_c0);
        }
        if ((reuseFrom._5_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_e0);
        }
        if ((reuseFrom._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&reuseFrom + 7));
        }
        if (local_19b == false) {
          pcVar2 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               *)local_b8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"PRECOMPILE_HEADERS_REUSE_FROM",
                     (allocator<char> *)((long)&compilePdb + 7));
          p_Var3 = (_Base_ptr)cmGeneratorTarget::GetSafeProperty(pcVar2,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::allocator<char>::~allocator((allocator<char> *)((long)&compilePdb + 7));
          local_f0 = p_Var3;
          pcVar2 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               *)local_b8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,"COMPILE_PDB_NAME",
                     (allocator<char> *)(e.field_2._M_local_buf + 0xf));
          p_Var3 = (_Base_ptr)cmGeneratorTarget::GetSafeProperty(pcVar2,&local_140);
          std::__cxx11::string::~string((string *)&local_140);
          std::allocator<char>::~allocator((allocator<char> *)(e.field_2._M_local_buf + 0xf));
          local_120 = p_Var3;
          uVar4 = std::__cxx11::string::empty();
          if (((uVar4 & 1) == 0) &&
             (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_f0,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_120), bVar1)) {
            pcVar2 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                     operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 *)local_b8);
            b = cmGeneratorTarget::GetName_abi_cxx11_(pcVar2);
            cmStrCat<char_const(&)[59],std::__cxx11::string_const&,char_const(&)[91],std::__cxx11::string_const&,char_const(&)[3]>
                      ((string *)local_168,
                       (char (*) [59])"PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"",
                       b,(char (*) [91])
                         "\"). Reusable precompile headers requires the COMPILE_PDB_NAME property to have the value \""
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_f0,(char (*) [3])0x115ea49);
            this_03 = GetCMakeInstance(this);
            std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::operator->
                      ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                       local_b8);
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_178);
            cmake::IssueMessage(this_03,FATAL_ERROR,(string *)local_168,
                                (cmListFileBacktrace *)local_178);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_178);
            __range1._4_1_ = 1;
            std::__cxx11::string::~string((string *)local_168);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
        ::operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = (bool)(__range1._4_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForPchCompilePdb() const
{
  if (!this->GetLanguageEnabled("C") && !this->GetLanguageEnabled("CXX")) {
    return false;
  }
  bool failed = false;
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& target : generator->GetGeneratorTargets()) {
      if (!target->CanCompileSources() ||
          target->GetProperty("ghs_integrity_app").IsOn()) {
        continue;
      }

      std::string const& reuseFrom =
        target->GetSafeProperty("PRECOMPILE_HEADERS_REUSE_FROM");
      std::string const& compilePdb =
        target->GetSafeProperty("COMPILE_PDB_NAME");

      if (!reuseFrom.empty() && reuseFrom != compilePdb) {
        const std::string e = cmStrCat(
          "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"",
          target->GetName(),
          "\"). Reusable precompile headers requires the COMPILE_PDB_NAME"
          " property to have the value \"",
          reuseFrom, "\"\n");
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e,
                                               target->GetBacktrace());
        failed = true;
      }
    }
  }
  return failed;
}